

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O2

void __thiscall UnifiedRegex::Matcher::ResetLoopInfos(Matcher *this)

{
  long lVar1;
  int i;
  long lVar2;
  
  lVar1 = 0;
  for (lVar2 = 0; lVar2 < ((this->program).ptr)->numLoops; lVar2 = lVar2 + 1) {
    LoopInfo::Reset((LoopInfo *)((long)&((this->loopInfos).ptr)->number + lVar1));
    lVar1 = lVar1 + 0x10;
  }
  return;
}

Assistant:

void Matcher::ResetLoopInfos()
    {
        for (int i = 0; i < program->numLoops; i++)
        {
            loopInfos[i].Reset();
        }
    }